

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

ostream * smf::Binasc::writeLittleEndianLong(ostream *out,long value)

{
  undefined1 local_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  anon_union_8_2_a3e1d9c2 data;
  long value_local;
  ostream *out_local;
  
  local_20 = (char)value;
  std::operator<<(out,local_20);
  uStack_1f = (char)((ulong)value >> 8);
  std::operator<<(out,uStack_1f);
  uStack_1e = (char)((ulong)value >> 0x10);
  std::operator<<(out,uStack_1e);
  uStack_1d = (char)((ulong)value >> 0x18);
  std::operator<<(out,uStack_1d);
  return out;
}

Assistant:

std::ostream& Binasc::writeLittleEndianLong(std::ostream& out, long value) {
	union { char bytes[4]; long l; } data;
	data.l = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	return out;
}